

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O1

int __thiscall
soul::ModuleCloner::clone
          (ModuleCloner *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Module *pMVar1;
  OutputDeclaration *args_1;
  Expression *args_3;
  WriteStream *pWVar2;
  pool_ptr<soul::heart::Expression> local_30;
  
  pMVar1 = this->newModule;
  args_1 = getRemappedOutput(this,*(OutputDeclaration **)(__fn + 0x20));
  if (*(Expression **)(__fn + 0x28) == (Expression *)0x0) {
    local_30.object = (Expression *)0x0;
  }
  else {
    local_30.object = cloneExpression(this,*(Expression **)(__fn + 0x28));
  }
  args_3 = cloneExpression(this,*(Expression **)(__fn + 0x30));
  pWVar2 = PoolAllocator::
           allocate<soul::heart::WriteStream,soul::CodeLocation_const&,soul::heart::OutputDeclaration&,soul::pool_ptr<soul::heart::Expression>,soul::heart::Expression&>
                     (&pMVar1->allocator->pool,(CodeLocation *)(__fn + 8),args_1,&local_30,args_3);
  return (int)pWVar2;
}

Assistant:

heart::WriteStream& clone (const heart::WriteStream& old)
    {
        return newModule.allocate<heart::WriteStream> (old.location,
                                                       getRemappedOutput (old.target),
                                                       cloneExpressionPtr (old.element),
                                                       cloneExpression (old.value));
    }